

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  size_t __nbytes;
  void *in_RSI;
  Grammer local_150;
  undefined1 local_a8 [8];
  Grammer g;
  
  g.grammer_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  Grammer::Grammer((Grammer *)local_a8);
  read((int)(Grammer *)local_a8,in_RSI,__nbytes);
  Grammer::Grammer(&local_150,(Grammer *)local_a8);
  Elimination(&local_150);
  Grammer::~Grammer(&local_150);
  g.grammer_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  Grammer::~Grammer((Grammer *)local_a8);
  return g.grammer_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
}

Assistant:

int main()
{
    Grammer g;
    read(g);
    //map<char, string>::iterator it;
    //for (it = g.grammer_map.begin(); it != g.grammer_map.end(); it++)
    //cout << (*it).first << "->" << (*it).second<<endl;
    Elimination(g);
//	system("pause");
    return 0;
}